

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *os,Array *array)

{
  ostream *poVar1;
  TypePrinter local_a0;
  
  anon_unknown_0::TypePrinter::TypePrinter(&local_a0,os);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_a0,array);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_a0);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Array array) {
  return TypePrinter(os).print(array);
}